

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O3

void asmjit::ConstPool_addGap(ConstPool *self,size_t offset,size_t length)

{
  Zone *this;
  Gap *pGVar1;
  size_t sVar2;
  long lVar3;
  
  if (length != 0) {
    do {
      if (length < 0x10) {
        if (7 < length) goto LAB_001651d2;
        if (3 < length) goto LAB_001651ec;
        if (length != 1 && (offset & 1) == 0) goto LAB_001651f8;
LAB_00165226:
        sVar2 = 1;
        lVar3 = 0;
      }
      else if ((offset & 0xf) == 0) {
        sVar2 = 0x10;
        lVar3 = 4;
      }
      else {
LAB_001651d2:
        if ((offset & 7) == 0) {
          sVar2 = 8;
          lVar3 = 3;
        }
        else {
LAB_001651ec:
          if ((offset & 3) == 0) {
            sVar2 = 4;
            lVar3 = 2;
          }
          else {
            if ((offset & 1) != 0) goto LAB_00165226;
LAB_001651f8:
            sVar2 = 2;
            lVar3 = 1;
          }
        }
      }
      pGVar1 = self->_gapPool;
      if (pGVar1 == (Gap *)0x0) {
        this = self->_zone;
        pGVar1 = (Gap *)this->_ptr;
        if ((ulong)((long)this->_end - (long)pGVar1) < 0x18) {
          pGVar1 = (Gap *)Zone::_alloc(this,0x18);
        }
        else {
          this->_ptr = (uint8_t *)(pGVar1 + 1);
          if ((Gap *)this->_end < pGVar1 + 1) {
            ConstPool_addGap();
          }
        }
        if (pGVar1 == (Gap *)0x0) {
          return;
        }
      }
      else {
        self->_gapPool = pGVar1->_next;
      }
      pGVar1->_next = self->_gaps[lVar3];
      self->_gaps[lVar3] = pGVar1;
      pGVar1->_offset = offset;
      offset = offset + sVar2;
      length = length - sVar2;
      pGVar1->_length = sVar2;
    } while (length != 0);
  }
  return;
}

Assistant:

static void ConstPool_addGap(ConstPool* self, size_t offset, size_t length) noexcept {
  ASMJIT_ASSERT(length > 0);

  while (length > 0) {
    size_t gapIndex;
    size_t gapLength;

      gapIndex = ConstPool::kIndex16;
    if (length >= 16 && Utils::isAligned<size_t>(offset, 16)) {
      gapLength = 16;
    }
    else if (length >= 8 && Utils::isAligned<size_t>(offset, 8)) {
      gapIndex = ConstPool::kIndex8;
      gapLength = 8;
    }
    else if (length >= 4 && Utils::isAligned<size_t>(offset, 4)) {
      gapIndex = ConstPool::kIndex4;
      gapLength = 4;
    }
    else if (length >= 2 && Utils::isAligned<size_t>(offset, 2)) {
      gapIndex = ConstPool::kIndex2;
      gapLength = 2;
    }
    else {
      gapIndex = ConstPool::kIndex1;
      gapLength = 1;
    }

    // We don't have to check for errors here, if this failed nothing really
    // happened (just the gap won't be visible) and it will fail again at
    // place where checking will cause kErrorNoHeapMemory.
    ConstPool::Gap* gap = ConstPool_allocGap(self);
    if (!gap) return;

    gap->_next = self->_gaps[gapIndex];
    self->_gaps[gapIndex] = gap;

    gap->_offset = offset;
    gap->_length = gapLength;

    offset += gapLength;
    length -= gapLength;
  }
}